

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O0

void test_nested(void)

{
  byte bVar1;
  int32_t iVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char **ppcVar6;
  undefined8 uVar7;
  int32_t *piVar8;
  undefined8 in_stack_ffffffffffffff70;
  undefined4 uVar9;
  undefined8 in_stack_ffffffffffffff78;
  undefined4 uVar10;
  bson_t *bcon;
  char *pcStack_28;
  int i32;
  char *utf8;
  
  uVar10 = (undefined4)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  uVar9 = (undefined4)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  uVar4 = bson_bcon_magic();
  iVar2 = bcon_ensure_int32(10);
  uVar4 = bcon_new(0,"hello","world","foo","{","bar",uVar4,CONCAT44(uVar9,0xf),
                   CONCAT44(uVar10,iVar2),"}",0);
  uVar5 = bson_bcone_magic();
  ppcVar6 = bcon_ensure_const_char_ptr_ptr(&stack0xffffffffffffffd8);
  uVar7 = bson_bcone_magic();
  piVar8 = bcon_ensure_int32_ptr((int32_t *)((long)&bcon + 4));
  bVar1 = bcon_extract(uVar4,"hello",uVar5,0,ppcVar6,"foo","{","bar",uVar7,0xf,piVar8,"}",0);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x1af,"test_nested",
            "BCON_EXTRACT (bcon, \"hello\", BCONE_UTF8 (utf8), \"foo\", \"{\", \"bar\", BCONE_INT32 (i32), \"}\")"
           );
    abort();
  }
  iVar3 = strcmp("world",pcStack_28);
  if (iVar3 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x1b1,"test_nested","strcmp (\"world\", utf8) == 0");
    abort();
  }
  if (bcon._4_4_ != 10) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x1b2,"test_nested","i32 == 10");
    abort();
  }
  bson_destroy(uVar4);
  return;
}

Assistant:

static void
test_nested (void)
{
   const char *utf8;
   int i32;

   bson_t *bcon =
      BCON_NEW ("hello", "world", "foo", "{", "bar", BCON_INT32 (10), "}");

   BSON_ASSERT (BCON_EXTRACT (bcon,
                         "hello",
                         BCONE_UTF8 (utf8),
                         "foo",
                         "{",
                         "bar",
                         BCONE_INT32 (i32),
                         "}"));

   BSON_ASSERT (strcmp ("world", utf8) == 0);
   BSON_ASSERT (i32 == 10);

   bson_destroy (bcon);
}